

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O2

CURLcode ftp_state_use_port(connectdata *conn,ftpport fcmd)

{
  char cVar1;
  unsigned_short uVar2;
  int iVar3;
  CURLcode CVar4;
  uint uVar5;
  uint uVar6;
  if2ip_result_t iVar7;
  size_t sVar8;
  char *pcVar9;
  char *__s;
  int *piVar10;
  ulong uVar11;
  undefined6 extraout_var;
  long lVar12;
  Curl_easy *pCVar13;
  Curl_addrinfo *ai;
  char cVar14;
  void *src;
  size_t sVar15;
  ftpport fVar16;
  ushort uVar17;
  ushort uVar18;
  int iVar19;
  char *pcVar20;
  curl_socket_t portsock;
  Curl_easy *local_a60;
  curl_socklen_t sslen;
  ftpport local_a54;
  undefined4 local_a50;
  uint local_a4c;
  pingpong *local_a48;
  Curl_dns_entry *h;
  Curl_sockaddr_storage ss;
  char buffer [128];
  char myhost [256];
  char tmp [1024];
  char hbuf [1025];
  
  pCVar13 = conn->data;
  portsock = -1;
  memset(myhost,0,0x100);
  pcVar20 = (pCVar13->set).str[0xc];
  h = (Curl_dns_entry *)0x0;
  local_a54 = fcmd;
  if ((pcVar20 == (char *)0x0) || (sVar8 = strlen(pcVar20), sVar8 < 2)) {
    pcVar9 = (char *)0x0;
    uVar18 = 0;
    local_a4c = 0;
  }
  else {
    sVar15 = 0x2f;
    if (0x2d < sVar8) {
      sVar15 = sVar8 + 1;
    }
    pcVar9 = (char *)(*Curl_ccalloc)(sVar15,1);
    if (pcVar9 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    __s = pcVar20;
    local_a60 = pCVar13;
    if (*pcVar20 == ':') {
LAB_0040796b:
      pcVar20 = strchr(__s,0x3a);
      if (pcVar20 == (char *)0x0) {
        uVar5 = 0;
        uVar6 = 0;
      }
      else {
        uVar11 = strtoul(pcVar20 + 1,(char **)0x0,10);
        uVar2 = curlx_ultous(uVar11);
        uVar5 = (uint)CONCAT62(extraout_var,uVar2);
        pcVar20 = strchr(pcVar20,0x2d);
        uVar6 = uVar5;
        if (pcVar20 != (char *)0x0) {
          uVar11 = strtoul(pcVar20 + 1,(char **)0x0,10);
          uVar2 = curlx_ultous(uVar11);
          uVar6 = (uint)uVar2;
        }
      }
    }
    else {
      if (*pcVar20 == '[') {
        __s = strchr(pcVar20,0x5d);
        if (__s != (char *)0x0) {
          pcVar20 = pcVar20 + 1;
LAB_00407953:
          strncpy(pcVar9,pcVar20,(long)__s - (long)pcVar20);
          goto LAB_0040796b;
        }
      }
      else {
        __s = strchr(pcVar20,0x3a);
        if ((__s != (char *)0x0) && (iVar3 = inet_pton(10,pcVar20,&ss), iVar3 != 1))
        goto LAB_00407953;
        strcpy(pcVar9,pcVar20);
      }
      uVar5 = 0;
      uVar6 = 0;
    }
    uVar18 = (ushort)uVar6;
    local_a4c = uVar5;
    if (uVar18 < (ushort)uVar5) {
      local_a4c = 0;
      uVar18 = 0;
    }
    pCVar13 = local_a60;
    if (*pcVar9 != '\0') {
      iVar3 = conn->ip_addr->ai_family;
      uVar6 = Curl_ipv6_scope(conn->ip_addr->ai_addr);
      pcVar20 = pcVar9;
      iVar7 = Curl_if2ip(iVar3,uVar6,conn->scope_id,pcVar9,hbuf,0x401);
      local_a50 = (undefined4)CONCAT71((int7)((ulong)pcVar20 >> 8),1);
      pcVar20 = pcVar9;
      if (iVar7 == IF2IP_NOT_FOUND) goto LAB_00407721;
      if (iVar7 == IF2IP_AF_NOT_SUPPORTED) {
        return CURLE_FTP_PORT_FAILED;
      }
      pCVar13 = local_a60;
      pcVar20 = hbuf;
      if (iVar7 == IF2IP_FOUND) goto LAB_00407721;
    }
  }
  sslen = 0x80;
  iVar3 = getsockname(conn->sock[0],(sockaddr *)&ss,&sslen);
  if (iVar3 != 0) {
    piVar10 = __errno_location();
    pcVar20 = Curl_strerror(*piVar10,buffer,0x80);
    Curl_failf(pCVar13,"getsockname() failed: %s",pcVar20);
    (*Curl_cfree)(pcVar9);
    return CURLE_FTP_PORT_FAILED;
  }
  uVar6 = (uint)ss.buffer.sa.sa_family;
  if (ss.buffer.sa.sa_family == 10) {
    src = (void *)((long)&ss.buffer + 8);
    uVar6 = 10;
  }
  else {
    src = (void *)((long)&ss.buffer + 4);
  }
  local_a60 = pCVar13;
  Curl_inet_ntop(uVar6,src,hbuf,0x401);
  local_a50 = 0;
  pcVar20 = hbuf;
LAB_00407721:
  Curl_resolv(conn,pcVar20,0,false,&h);
  if (h != (Curl_dns_entry *)0x0) {
    ai = h->addr;
    Curl_resolv_unlock(local_a60,h);
    if (ai != (Curl_addrinfo *)0x0) {
      local_a48 = (pingpong *)&conn->proto;
      (*Curl_cfree)(pcVar9);
      portsock = -1;
      iVar3 = 0;
      while( true ) {
        if (ai == (Curl_addrinfo *)0x0) {
          pcVar20 = Curl_strerror(iVar3,buffer,0x80);
          Curl_failf(local_a60,"socket failure: %s",pcVar20);
          return CURLE_FTP_PORT_FAILED;
        }
        CVar4 = Curl_socket(conn,ai,(Curl_sockaddr_ex *)0x0,&portsock);
        if (CVar4 == CURLE_OK) break;
        piVar10 = __errno_location();
        iVar3 = *piVar10;
        ai = ai->ai_next;
      }
      memcpy(&ss,ai->ai_addr,(ulong)ai->ai_addrlen);
      sslen = ai->ai_addrlen;
      uVar6 = local_a4c;
      while( true ) {
        uVar17 = (ushort)uVar6;
        if (uVar18 < uVar17) {
          Curl_failf(local_a60,"bind() failed, we ran out of ports!");
          goto LAB_00407adc;
        }
        ss.buffer.sa_in.sin_port = uVar17 << 8 | uVar17 >> 8;
        iVar3 = bind(portsock,(sockaddr *)&ss,sslen);
        if (iVar3 == 0) break;
        piVar10 = __errno_location();
        iVar3 = *piVar10;
        if ((iVar3 == 99 & (byte)local_a50) == 1) {
          pcVar20 = Curl_strerror(99,buffer,0x80);
          local_a50 = 0;
          Curl_infof(local_a60,"bind(port=%hu) on non-local address failed: %s\n",
                     (ulong)(uVar6 & 0xffff),pcVar20);
          sslen = 0x80;
          iVar3 = getsockname(conn->sock[0],(sockaddr *)&ss,&sslen);
          uVar6 = local_a4c;
          if (iVar3 != 0) {
            pcVar20 = Curl_strerror(*piVar10,buffer,0x80);
            Curl_failf(local_a60,"getsockname() failed: %s",pcVar20);
LAB_00407adc:
            Curl_closesocket(conn,portsock);
            return CURLE_FTP_PORT_FAILED;
          }
        }
        else {
          if ((iVar3 != 0xd) && (iVar3 != 0x62)) {
            pcVar20 = Curl_strerror(iVar3,buffer,0x80);
            Curl_failf(local_a60,"bind(port=%hu) failed: %s",(ulong)(uVar6 & 0xffff),pcVar20);
            goto LAB_00407adc;
          }
          uVar6 = uVar6 + 1;
        }
      }
      sslen = 0x80;
      iVar3 = getsockname(portsock,(sockaddr *)&ss,&sslen);
      if (iVar3 == 0) {
        iVar19 = 1;
        iVar3 = listen(portsock,1);
        if (iVar3 == 0) {
          Curl_printable_address(ai,myhost,0x100);
          pCVar13 = local_a60;
          uVar6 = *(uint *)&(conn->bits).field_0x4;
          if ((uVar6 & 0x40400) == 0x400) {
            uVar6 = uVar6 | 0x40000;
            *(uint *)&(conn->bits).field_0x4 = uVar6;
          }
          fVar16 = local_a54;
          do {
            if (fVar16 == DONE) {
              iVar19 = 2;
LAB_00407bdf:
              (conn->proto).ftpc.count1 = iVar19;
              close_secondarysocket(conn);
              conn->sock[1] = portsock;
              (conn->bits).tcpconnect[1] = true;
              (conn->proto).ftpc.state = FTP_PORT;
              return CURLE_OK;
            }
            if ((((uVar6 & 0x40000) != 0 || fVar16 != EPRT) &&
                (fVar16 != PORT || ss.buffer.sa.sa_family == 2)) &&
               ((ss.buffer.sa.sa_family | 8) == 10)) {
              if (fVar16 == EPRT) {
                iVar19 = 0;
                CVar4 = Curl_pp_sendf(local_a48,"%s |%d|%s|%hu|",ftp_state_use_port::mode,
                                      (ulong)((ss.buffer.sa.sa_family != 2) + 1),myhost,
                                      (ulong)(ushort)(ss.buffer.sa_in.sin_port << 8 |
                                                     ss.buffer.sa_in.sin_port >> 8));
                if (CVar4 == CURLE_OK) goto LAB_00407bdf;
                pcVar20 = curl_easy_strerror(CVar4);
                Curl_failf(pCVar13,"Failure sending EPRT command: %s",pcVar20);
                Curl_closesocket(conn,portsock);
                (conn->proto).ftpc.count1 = 1;
                goto LAB_00407d23;
              }
              if (fVar16 == PORT) {
                lVar12 = 0;
                while( true ) {
                  cVar1 = myhost[lVar12];
                  cVar14 = ',';
                  if ((cVar1 != '.') && (cVar14 = cVar1, cVar1 == '\0')) break;
                  tmp[lVar12] = cVar14;
                  lVar12 = lVar12 + 1;
                }
                tmp[lVar12] = '\0';
                curl_msnprintf(tmp + lVar12,0x14,",%d,%d",(ulong)(ss.buffer.sa_in.sin_port & 0xff),
                               (ulong)(byte)((ushort)ss.buffer._2_2_ >> 8));
                CVar4 = Curl_pp_sendf(local_a48,"%s %s",0x499a21,tmp);
                if (CVar4 == CURLE_OK) goto LAB_00407bdf;
                pcVar20 = curl_easy_strerror(CVar4);
                Curl_failf(pCVar13,"Failure sending PORT command: %s",pcVar20);
                Curl_closesocket(conn,portsock);
LAB_00407d23:
                (conn->proto).ftpc.state = FTP_STOP;
                return CVar4;
              }
            }
            fVar16 = fVar16 + PORT;
          } while( true );
        }
        piVar10 = __errno_location();
        pcVar20 = Curl_strerror(*piVar10,buffer,0x80);
        pcVar9 = "socket failure: %s";
      }
      else {
        piVar10 = __errno_location();
        pcVar20 = Curl_strerror(*piVar10,buffer,0x80);
        pcVar9 = "getsockname() failed: %s";
      }
      Curl_failf(local_a60,pcVar9,pcVar20);
      Curl_closesocket(conn,portsock);
      return CURLE_FTP_PORT_FAILED;
    }
  }
  Curl_failf(local_a60,"failed to resolve the address provided to PORT: %s",pcVar20);
  (*Curl_cfree)(pcVar9);
  return CURLE_FTP_PORT_FAILED;
}

Assistant:

static CURLcode ftp_state_use_port(struct connectdata *conn,
                                   ftpport fcmd) /* start with this */

{
  CURLcode result = CURLE_OK;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  struct Curl_easy *data = conn->data;
  curl_socket_t portsock = CURL_SOCKET_BAD;
  char myhost[256] = "";

  struct Curl_sockaddr_storage ss;
  Curl_addrinfo *res, *ai;
  curl_socklen_t sslen;
  char hbuf[NI_MAXHOST];
  struct sockaddr *sa = (struct sockaddr *)&ss;
  struct sockaddr_in * const sa4 = (void *)sa;
#ifdef ENABLE_IPV6
  struct sockaddr_in6 * const sa6 = (void *)sa;
#endif
  char tmp[1024];
  static const char mode[][5] = { "EPRT", "PORT" };
  int rc;
  int error;
  char *host = NULL;
  char *string_ftpport = data->set.str[STRING_FTPPORT];
  struct Curl_dns_entry *h = NULL;
  unsigned short port_min = 0;
  unsigned short port_max = 0;
  unsigned short port;
  bool possibly_non_local = TRUE;
  char buffer[STRERROR_LEN];
  char *addr = NULL;

  /* Step 1, figure out what is requested,
   * accepted format :
   * (ipv4|ipv6|domain|interface)?(:port(-range)?)?
   */

  if(data->set.str[STRING_FTPPORT] &&
     (strlen(data->set.str[STRING_FTPPORT]) > 1)) {

#ifdef ENABLE_IPV6
    size_t addrlen = INET6_ADDRSTRLEN > strlen(string_ftpport) ?
      INET6_ADDRSTRLEN : strlen(string_ftpport);
#else
    size_t addrlen = INET_ADDRSTRLEN > strlen(string_ftpport) ?
      INET_ADDRSTRLEN : strlen(string_ftpport);
#endif
    char *ip_start = string_ftpport;
    char *ip_end = NULL;
    char *port_start = NULL;
    char *port_sep = NULL;

    addr = calloc(addrlen + 1, 1);
    if(!addr)
      return CURLE_OUT_OF_MEMORY;

#ifdef ENABLE_IPV6
    if(*string_ftpport == '[') {
      /* [ipv6]:port(-range) */
      ip_start = string_ftpport + 1;
      ip_end = strchr(string_ftpport, ']');
      if(ip_end)
        strncpy(addr, ip_start, ip_end - ip_start);
    }
    else
#endif
      if(*string_ftpport == ':') {
        /* :port */
        ip_end = string_ftpport;
      }
      else {
        ip_end = strchr(string_ftpport, ':');
        if(ip_end) {
          /* either ipv6 or (ipv4|domain|interface):port(-range) */
#ifdef ENABLE_IPV6
          if(Curl_inet_pton(AF_INET6, string_ftpport, sa6) == 1) {
            /* ipv6 */
            port_min = port_max = 0;
            strcpy(addr, string_ftpport);
            ip_end = NULL; /* this got no port ! */
          }
          else
#endif
            /* (ipv4|domain|interface):port(-range) */
            strncpy(addr, string_ftpport, ip_end - ip_start);
        }
        else
          /* ipv4|interface */
          strcpy(addr, string_ftpport);
      }

    /* parse the port */
    if(ip_end != NULL) {
      port_start = strchr(ip_end, ':');
      if(port_start) {
        port_min = curlx_ultous(strtoul(port_start + 1, NULL, 10));
        port_sep = strchr(port_start, '-');
        if(port_sep) {
          port_max = curlx_ultous(strtoul(port_sep + 1, NULL, 10));
        }
        else
          port_max = port_min;
      }
    }

    /* correct errors like:
     *  :1234-1230
     *  :-4711,  in this case port_min is (unsigned)-1,
     *           therefore port_min > port_max for all cases
     *           but port_max = (unsigned)-1
     */
    if(port_min > port_max)
      port_min = port_max = 0;


    if(*addr != '\0') {
      /* attempt to get the address of the given interface name */
      switch(Curl_if2ip(conn->ip_addr->ai_family,
                        Curl_ipv6_scope(conn->ip_addr->ai_addr),
                        conn->scope_id, addr, hbuf, sizeof(hbuf))) {
        case IF2IP_NOT_FOUND:
          /* not an interface, use the given string as host name instead */
          host = addr;
          break;
        case IF2IP_AF_NOT_SUPPORTED:
          return CURLE_FTP_PORT_FAILED;
        case IF2IP_FOUND:
          host = hbuf; /* use the hbuf for host name */
      }
    }
    else
      /* there was only a port(-range) given, default the host */
      host = NULL;
  } /* data->set.ftpport */

  if(!host) {
    /* not an interface and not a host name, get default by extracting
       the IP from the control connection */
    sslen = sizeof(ss);
    if(getsockname(conn->sock[FIRSTSOCKET], sa, &sslen)) {
      failf(data, "getsockname() failed: %s",
            Curl_strerror(SOCKERRNO, buffer, sizeof(buffer)));
      free(addr);
      return CURLE_FTP_PORT_FAILED;
    }
    switch(sa->sa_family) {
#ifdef ENABLE_IPV6
    case AF_INET6:
      Curl_inet_ntop(sa->sa_family, &sa6->sin6_addr, hbuf, sizeof(hbuf));
      break;
#endif
    default:
      Curl_inet_ntop(sa->sa_family, &sa4->sin_addr, hbuf, sizeof(hbuf));
      break;
    }
    host = hbuf; /* use this host name */
    possibly_non_local = FALSE; /* we know it is local now */
  }

  /* resolv ip/host to ip */
  rc = Curl_resolv(conn, host, 0, FALSE, &h);
  if(rc == CURLRESOLV_PENDING)
    (void)Curl_resolver_wait_resolv(conn, &h);
  if(h) {
    res = h->addr;
    /* when we return from this function, we can forget about this entry
       to we can unlock it now already */
    Curl_resolv_unlock(data, h);
  } /* (h) */
  else
    res = NULL; /* failure! */

  if(res == NULL) {
    failf(data, "failed to resolve the address provided to PORT: %s", host);
    free(addr);
    return CURLE_FTP_PORT_FAILED;
  }

  free(addr);
  host = NULL;

  /* step 2, create a socket for the requested address */

  portsock = CURL_SOCKET_BAD;
  error = 0;
  for(ai = res; ai; ai = ai->ai_next) {
    result = Curl_socket(conn, ai, NULL, &portsock);
    if(result) {
      error = SOCKERRNO;
      continue;
    }
    break;
  }
  if(!ai) {
    failf(data, "socket failure: %s",
          Curl_strerror(error, buffer, sizeof(buffer)));
    return CURLE_FTP_PORT_FAILED;
  }

  /* step 3, bind to a suitable local address */

  memcpy(sa, ai->ai_addr, ai->ai_addrlen);
  sslen = ai->ai_addrlen;

  for(port = port_min; port <= port_max;) {
    if(sa->sa_family == AF_INET)
      sa4->sin_port = htons(port);
#ifdef ENABLE_IPV6
    else
      sa6->sin6_port = htons(port);
#endif
    /* Try binding the given address. */
    if(bind(portsock, sa, sslen) ) {
      /* It failed. */
      error = SOCKERRNO;
      if(possibly_non_local && (error == EADDRNOTAVAIL)) {
        /* The requested bind address is not local.  Use the address used for
         * the control connection instead and restart the port loop
         */
        infof(data, "bind(port=%hu) on non-local address failed: %s\n", port,
              Curl_strerror(error, buffer, sizeof(buffer)));

        sslen = sizeof(ss);
        if(getsockname(conn->sock[FIRSTSOCKET], sa, &sslen)) {
          failf(data, "getsockname() failed: %s",
                Curl_strerror(SOCKERRNO, buffer, sizeof(buffer)));
          Curl_closesocket(conn, portsock);
          return CURLE_FTP_PORT_FAILED;
        }
        port = port_min;
        possibly_non_local = FALSE; /* don't try this again */
        continue;
      }
      if(error != EADDRINUSE && error != EACCES) {
        failf(data, "bind(port=%hu) failed: %s", port,
              Curl_strerror(error, buffer, sizeof(buffer)));
        Curl_closesocket(conn, portsock);
        return CURLE_FTP_PORT_FAILED;
      }
    }
    else
      break;

    port++;
  }

  /* maybe all ports were in use already*/
  if(port > port_max) {
    failf(data, "bind() failed, we ran out of ports!");
    Curl_closesocket(conn, portsock);
    return CURLE_FTP_PORT_FAILED;
  }

  /* get the name again after the bind() so that we can extract the
     port number it uses now */
  sslen = sizeof(ss);
  if(getsockname(portsock, (struct sockaddr *)sa, &sslen)) {
    failf(data, "getsockname() failed: %s",
          Curl_strerror(SOCKERRNO, buffer, sizeof(buffer)));
    Curl_closesocket(conn, portsock);
    return CURLE_FTP_PORT_FAILED;
  }

  /* step 4, listen on the socket */

  if(listen(portsock, 1)) {
    failf(data, "socket failure: %s",
          Curl_strerror(SOCKERRNO, buffer, sizeof(buffer)));
    Curl_closesocket(conn, portsock);
    return CURLE_FTP_PORT_FAILED;
  }

  /* step 5, send the proper FTP command */

  /* get a plain printable version of the numerical address to work with
     below */
  Curl_printable_address(ai, myhost, sizeof(myhost));

#ifdef ENABLE_IPV6
  if(!conn->bits.ftp_use_eprt && conn->bits.ipv6)
    /* EPRT is disabled but we are connected to a IPv6 host, so we ignore the
       request and enable EPRT again! */
    conn->bits.ftp_use_eprt = TRUE;
#endif

  for(; fcmd != DONE; fcmd++) {

    if(!conn->bits.ftp_use_eprt && (EPRT == fcmd))
      /* if disabled, goto next */
      continue;

    if((PORT == fcmd) && sa->sa_family != AF_INET)
      /* PORT is IPv4 only */
      continue;

    switch(sa->sa_family) {
    case AF_INET:
      port = ntohs(sa4->sin_port);
      break;
#ifdef ENABLE_IPV6
    case AF_INET6:
      port = ntohs(sa6->sin6_port);
      break;
#endif
    default:
      continue; /* might as well skip this */
    }

    if(EPRT == fcmd) {
      /*
       * Two fine examples from RFC2428;
       *
       * EPRT |1|132.235.1.2|6275|
       *
       * EPRT |2|1080::8:800:200C:417A|5282|
       */

      result = Curl_pp_sendf(&ftpc->pp, "%s |%d|%s|%hu|", mode[fcmd],
                             sa->sa_family == AF_INET?1:2,
                             myhost, port);
      if(result) {
        failf(data, "Failure sending EPRT command: %s",
              curl_easy_strerror(result));
        Curl_closesocket(conn, portsock);
        /* don't retry using PORT */
        ftpc->count1 = PORT;
        /* bail out */
        state(conn, FTP_STOP);
        return result;
      }
      break;
    }
    if(PORT == fcmd) {
      char *source = myhost;
      char *dest = tmp;

      /* translate x.x.x.x to x,x,x,x */
      while(source && *source) {
        if(*source == '.')
          *dest = ',';
        else
          *dest = *source;
        dest++;
        source++;
      }
      *dest = 0;
      msnprintf(dest, 20, ",%d,%d", (int)(port>>8), (int)(port&0xff));

      result = Curl_pp_sendf(&ftpc->pp, "%s %s", mode[fcmd], tmp);
      if(result) {
        failf(data, "Failure sending PORT command: %s",
              curl_easy_strerror(result));
        Curl_closesocket(conn, portsock);
        /* bail out */
        state(conn, FTP_STOP);
        return result;
      }
      break;
    }
  }

  /* store which command was sent */
  ftpc->count1 = fcmd;

  close_secondarysocket(conn);

  /* we set the secondary socket variable to this for now, it is only so that
     the cleanup function will close it in case we fail before the true
     secondary stuff is made */
  conn->sock[SECONDARYSOCKET] = portsock;

  /* this tcpconnect assignment below is a hackish work-around to make the
     multi interface with active FTP work - as it will not wait for a
     (passive) connect in Curl_is_connected().

     The *proper* fix is to make sure that the active connection from the
     server is done in a non-blocking way. Currently, it is still BLOCKING.
  */
  conn->bits.tcpconnect[SECONDARYSOCKET] = TRUE;

  state(conn, FTP_PORT);
  return result;
}